

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Setpoint.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Setpoint::ArchiveIN(ChFunction_Setpoint *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Setpoint>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->Y;
  local_38 = "Y";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->Y_dx;
  local_38 = "Y_dx";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->Y_dxdx;
  local_38 = "Y_dxdx";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Setpoint>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(Y);
    marchive >> CHNVP(Y_dx);
    marchive >> CHNVP(Y_dxdx);
}